

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseAssertTrapCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  bool bVar2;
  Result RVar3;
  Command *pCVar4;
  Enum EVar5;
  
  RVar3 = Expect(this,Lpar);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    RVar3 = Expect(this,AssertTrap);
    if (RVar3.enum_ != Error) {
      bVar2 = PeekMatchLpar(this,Module);
      pCVar4 = (Command *)operator_new(0x38);
      pCVar4->_vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar4->type = 0;
      pCVar4[1]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar4[1].type = 0;
      pCVar4[2]._vptr_Command = (_func_int **)0x0;
      *(undefined8 *)&pCVar4[2].type = 0;
      pCVar4[3]._vptr_Command = (_func_int **)0x0;
      pCVar4->_vptr_Command = (_func_int **)&PTR__Command_001a70a8;
      if (bVar2) {
        pCVar4->type = AssertUninstantiable;
        pCVar4->_vptr_Command = (_func_int **)&PTR__AssertModuleCommand_001a8b00;
        pCVar4[1]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar4[1].type = &pCVar4[2].type;
        pCVar4[2]._vptr_Command = (_func_int **)0x0;
        *(undefined1 *)&pCVar4[2].type = First;
        RVar3 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                        *)(pCVar4 + 1));
      }
      else {
        pCVar4->type = AssertTrap;
        pCVar4->_vptr_Command = (_func_int **)&PTR__AssertTrapCommandBase_001a8b50;
        pCVar4[1]._vptr_Command = (_func_int **)0x0;
        *(CommandType **)&pCVar4[1].type = &pCVar4[2].type;
        pCVar4[2]._vptr_Command = (_func_int **)0x0;
        *(undefined1 *)&pCVar4[2].type = First;
        RVar3 = ParseAction(this,(ActionPtr *)(pCVar4 + 1));
      }
      bVar2 = false;
      if (RVar3.enum_ != Error) {
        RVar3 = ParseQuotedText(this,(string *)&pCVar4[1].type,true);
        if (RVar3.enum_ == Error) {
          bVar2 = false;
        }
        else {
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar4;
          bVar2 = true;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
          }
          pCVar4 = (Command *)0x0;
        }
      }
      if (pCVar4 != (Command *)0x0) {
        (*pCVar4->_vptr_Command[1])(pCVar4);
      }
      if (bVar2) {
        RVar3 = Expect(this,Rpar);
        EVar5 = (Enum)(RVar3.enum_ == Error);
      }
    }
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseAssertTrapCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertTrapCommand);
  EXPECT(Lpar);
  EXPECT(AssertTrap);
  if (PeekMatchLpar(TokenType::Module)) {
    auto command = std::make_unique<AssertUninstantiableCommand>();
    CHECK_RESULT(ParseScriptModule(&command->module));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  } else {
    auto command = std::make_unique<AssertTrapCommand>();
    CHECK_RESULT(ParseAction(&command->action));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  }
  EXPECT(Rpar);
  return Result::Ok;
}